

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1be8a27::AV1Convolve2DHighbdCompoundTest::Convolve
          (AV1Convolve2DHighbdCompoundTest *this,highbd_convolve_2d_func test_func,uint16_t *src1,
          uint16_t *src2,uint16_t *dst,uint16_t *conv_buf,CompoundParam *compound,InterpFilter h_f,
          InterpFilter v_f,int sub_x,int sub_y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ParamType *pPVar5;
  InterpFilterParams *pIVar6;
  InterpFilterParams *pIVar7;
  undefined3 in_stack_00000019;
  ConvolveParams conv_params;
  
  pPVar5 = testing::
           WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>_>
           ::GetParam();
  iVar1 = (pPVar5->block_).width_;
  iVar2 = (pPVar5->block_).height_;
  pPVar5 = testing::
           WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>_>
           ::GetParam();
  iVar3 = pPVar5->bd_;
  conv_params.is_compound = 1;
  conv_params.round_0 = 3;
  conv_params.round_1 = 7;
  if (10 < iVar3) {
    conv_params.round_0 = iVar3 + -7;
  }
  iVar4 = conv_params.round_0;
  pIVar7 = av1_interp_4tap + h_f;
  if (4 < iVar2) {
    pIVar7 = av1_interp_filter_params_list + h_f;
  }
  if (h_f == MULTITAP_SHARP2) {
    pIVar7 = av1_interp_filter_params_list + h_f;
  }
  pIVar6 = av1_interp_4tap + ((ulong)compound & 0xff);
  if (4 < iVar1) {
    pIVar6 = av1_interp_filter_params_list + ((ulong)compound & 0xff);
  }
  if ((char)compound == '\x04') {
    pIVar6 = av1_interp_filter_params_list + ((ulong)compound & 0xff);
  }
  conv_params.dst_stride = 0x80;
  conv_params.plane = 0;
  conv_params.do_average = 0;
  conv_params.use_dist_wtd_comp_avg = (int)(byte)*conv_buf;
  conv_params._40_8_ = *(undefined8 *)(conv_buf + 2);
  conv_params.dst = dst;
  (*(code *)this)(test_func,iVar1,src2,0x80,iVar1,iVar2,pIVar6,pIVar7,_v_f,sub_x,&conv_params,iVar3)
  ;
  conv_params.do_average = 1;
  conv_params.dst_stride = 0x80;
  conv_params.round_1 = 7;
  conv_params.plane = 0;
  conv_params.is_compound = 1;
  conv_params.use_dist_wtd_comp_avg = (int)(byte)*conv_buf;
  conv_params._40_8_ = *(undefined8 *)(conv_buf + 2);
  conv_params.dst = dst;
  conv_params.round_0 = iVar4;
  (*(code *)this)(src1,iVar1,src2,0x80,iVar1,iVar2,pIVar6,pIVar7,_v_f,sub_x,&conv_params,iVar3);
  return;
}

Assistant:

void Convolve(highbd_convolve_2d_func test_func, const uint16_t *src1,
                const uint16_t *src2, uint16_t *dst, uint16_t *conv_buf,
                const CompoundParam &compound, const InterpFilter h_f,
                const InterpFilter v_f, const int sub_x, const int sub_y) {
    const BlockSize &block = GetParam().Block();
    const int width = block.Width();
    const int height = block.Height();

    const InterpFilterParams *filter_params_x =
        av1_get_interp_filter_params_with_block_size(h_f, width);
    const InterpFilterParams *filter_params_y =
        av1_get_interp_filter_params_with_block_size(v_f, height);
    const int bit_depth = GetParam().BitDepth();
    ConvolveParams conv_params =
        GetConvolveParams(0, conv_buf, kOutputStride, bit_depth, compound);
    test_func(src1, width, dst, kOutputStride, width, height, filter_params_x,
              filter_params_y, sub_x, sub_y, &conv_params, bit_depth);

    conv_params =
        GetConvolveParams(1, conv_buf, kOutputStride, bit_depth, compound);
    test_func(src2, width, dst, kOutputStride, width, height, filter_params_x,
              filter_params_y, sub_x, sub_y, &conv_params, bit_depth);
  }